

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::InvocationExpressionSyntax::setChild
          (InvocationExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  SyntaxNode *pSVar3;
  ArgumentListSyntax *pAVar4;
  
  pSVar3 = TokenOrSyntax::node(&child);
  if (index == 2) {
    if (pSVar3 == (SyntaxNode *)0x0) {
      pAVar4 = (ArgumentListSyntax *)0x0;
    }
    else {
      pAVar4 = (ArgumentListSyntax *)TokenOrSyntax::node(&child);
    }
    this->arguments = pAVar4;
  }
  else if (index == 1) {
    (this->attributes).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar3->previewNode;
    uVar2 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar1 = pSVar3->parent;
    (this->attributes).super_SyntaxListBase.super_SyntaxNode.kind = pSVar3->kind;
    *(undefined4 *)&(this->attributes).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar2;
    (this->attributes).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
    (this->attributes).super_SyntaxListBase.childCount = *(size_t *)(pSVar3 + 1);
    pSVar1 = pSVar3[1].previewNode;
    (this->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
    _M_ptr = (pointer)pSVar3[1].parent;
    (this->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
    _M_extent._M_extent_value = (size_t)pSVar1;
  }
  else {
    if (pSVar3 == (SyntaxNode *)0x0) {
      pSVar3 = (SyntaxNode *)0x0;
    }
    else {
      pSVar3 = TokenOrSyntax::node(&child);
    }
    (this->left).ptr = (ExpressionSyntax *)pSVar3;
  }
  return;
}

Assistant:

void InvocationExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: left = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: arguments = child.node() ? &child.node()->as<ArgumentListSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}